

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool __thiscall
r_exec::IPGMContext::evaluate_no_dereference(IPGMContext *this,uint16_t *result_index)

{
  Atom *pAVar1;
  View *pVVar2;
  undefined2 uVar3;
  Data DVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  uint16_t opcode;
  short sVar8;
  uint uVar9;
  int iVar10;
  uint16_t i_1;
  uint16_t i;
  ushort uVar11;
  uint16_t unused_result_index_1;
  uint16_t unused_result_index;
  _func_bool_Context_ptr_uint16_t_ptr *local_98;
  Context _c;
  IPGMContext local_60;
  
  bVar6 = true;
  switch((this->super__Context).data) {
  case REFERENCE:
  case VALUE_ARRAY:
    break;
  default:
    bVar5 = r_code::Atom::getDescriptor();
    uVar9 = bVar5 - 0xc1;
    if (uVar9 < 0xe) {
      if ((0x3f8bU >> (uVar9 & 0x1f) & 1) != 0) {
        iVar10 = (*(this->super__Context)._vptr__Context[6])(this);
        uVar11 = 1;
        do {
          if ((ushort)iVar10 < uVar11) {
            *result_index = (this->super__Context).index;
            return true;
          }
          getChild(&local_60,this,uVar11);
          operator*((IPGMContext *)&_c,&local_60);
          bVar6 = evaluate_no_dereference((IPGMContext *)&_c,&unused_result_index);
          uVar11 = uVar11 + 1;
        } while (bVar6);
        goto switchD_001726df_caseD_7;
      }
      if (uVar9 == 2) {
        sVar8 = r_code::Atom::asOpcode();
        if ((sVar8 != Opcodes::Ptn) && (sVar8 = r_code::Atom::asOpcode(), sVar8 != Opcodes::AntiPtn)
           ) goto switchD_001726df_caseD_7;
      }
      else if (uVar9 == 4) {
        opcode = r_code::Atom::asOpcode();
        Operator::Get((Operator *)&unused_result_index,opcode);
        if (_unused_result_index == syn) {
          return true;
        }
        if (_unused_result_index == red) {
LAB_00172876:
          _c.implementation = (_Context *)operator_new(0x30);
          uVar3 = *(undefined2 *)&(this->super__Context).field_0x1a;
          DVar4 = (this->super__Context).data;
          (_c.implementation)->index = (this->super__Context).index;
          *(undefined2 *)&(_c.implementation)->field_0x1a = uVar3;
          (_c.implementation)->data = DVar4;
          pAVar1 = (this->super__Context).code;
          (_c.implementation)->overlay = (this->super__Context).overlay;
          (_c.implementation)->code = pAVar1;
          (_c.implementation)->_vptr__Context = (_func_int **)&PTR___Context_001d0488;
          pVVar2 = this->view;
          _c.implementation[1]._vptr__Context = (_func_int **)this->object;
          _c.implementation[1].overlay = (Overlay *)pVVar2;
          _c._vptr_Context = (_func_int **)&PTR__Context_001d0508;
          bVar6 = (*_unused_result_index)(&_c,result_index);
          bVar7 = true;
          if (!bVar6) {
            if (local_98 == (_func_bool_Context_ptr_uint16_t_ptr *)0x0) {
              bVar7 = false;
            }
            else {
              bVar7 = (*local_98)(&_c,result_index);
            }
          }
          _c._vptr_Context = (_func_int **)&PTR__Context_001d0508;
          if (_c.implementation != (_Context *)0x0) {
            (*(_c.implementation)->_vptr__Context[1])();
            return bVar7;
          }
          return bVar7;
        }
        iVar10 = (*(this->super__Context)._vptr__Context[6])(this);
        uVar11 = 1;
        do {
          if ((ushort)iVar10 < uVar11) goto LAB_00172876;
          getChild(&local_60,this,uVar11);
          operator*((IPGMContext *)&_c,&local_60);
          bVar6 = evaluate_no_dereference((IPGMContext *)&_c,&unused_result_index_1);
          uVar11 = uVar11 + 1;
        } while (bVar6);
        goto switchD_001726df_caseD_7;
      }
    }
  case VIEW:
  case MKS:
  case VWS:
    *result_index = (this->super__Context).index;
    break;
  case UNDEFINED:
switchD_001726df_caseD_7:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool IPGMContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case REFERENCE:
    case VALUE_ARRAY:
        return true;

    case UNDEFINED:
        return false;

    case VIEW:
    case MKS:
    case VWS:
        result_index = index;
        return true;
    }

    switch (code[index].getDescriptor()) {
    case Atom::OPERATOR: {
        Operator op = Operator::Get((*this)[0].asOpcode());

        if (op.is_syn()) {
            return true;
        }

        if (!op.is_red()) { // red will prevent the evaluation of its productions before reducting its input.
            uint16_t atom_count = getChildrenCount();

            for (uint16_t i = 1; i <= atom_count; ++i) {
                uint16_t unused_result_index;

                if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                    return false;
                }
            }
        }

        IPGMContext *__c = new IPGMContext(*this);
        Context _c(__c);
        return op(_c, result_index);
    }

    case Atom::OBJECT: // incl. cmd.
        if ((*this)[0].asOpcode() == Opcodes::Ptn || (*this)[0].asOpcode() == Opcodes::AntiPtn) { // skip patterns.
            result_index = index;
            return true;
        }
        return false;

    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}